

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::grow(buffer<char> *base,size_t param_2)

{
  char *pcVar1;
  _IO_FILE *p_Var2;
  char *ptr;
  char *pcVar3;
  char *pcVar4;
  
  pcVar1 = base[1].ptr_;
  pcVar4 = *(char **)(pcVar1 + 0x40);
  pcVar3 = (char *)(*(long *)(pcVar1 + 0x28) + base->size_);
  *(char **)(pcVar1 + 0x28) = pcVar3;
  if (pcVar4 == pcVar3) {
    glibc_file<_IO_FILE>::flush((glibc_file<_IO_FILE> *)(base + 1));
    p_Var2 = ((file_base<_IO_FILE> *)&base[1].ptr_)->file_;
    pcVar3 = p_Var2->_IO_write_ptr;
    pcVar4 = p_Var2->_IO_buf_end;
  }
  base->ptr_ = pcVar3;
  base->capacity_ = (long)pcVar4 - (long)pcVar3;
  base->size_ = 0;
  return;
}

Assistant:

static void grow(buffer<char>& base, size_t) {
    auto& self = static_cast<file_print_buffer&>(base);
    self.file_.advance_write_buffer(self.size());
    if (self.file_.get_write_buffer().size == 0) self.file_.flush();
    auto buf = self.file_.get_write_buffer();
    FMT_ASSERT(buf.size > 0, "");
    self.set(buf.data, buf.size);
    self.clear();
  }